

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O3

void cpu_change_pstate_sparc64(CPUSPARCState_conflict1 *env,uint32_t new_pstate)

{
  target_ulong *ptVar1;
  target_ulong tVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  if (((env->def).features & 0x2000) == 0) {
    uVar5 = new_pstate & 0xc01;
    uVar4 = env->pstate & 0xc01;
    if (uVar5 != uVar4) {
      if (uVar5 == 0x800) {
        lVar3 = 0x1ce8;
      }
      else if (uVar5 == 0x400) {
        lVar3 = 0x1d28;
      }
      else {
        lVar3 = 0x1ca8;
        if (uVar5 == 1) {
          lVar3 = 0x1c68;
        }
      }
      if (uVar4 == 0x800) {
        lVar6 = 0x1ce8;
      }
      else if (uVar4 == 0x400) {
        lVar6 = 0x1d28;
      }
      else {
        lVar6 = 0x1ca8;
        if (uVar4 == 1) {
          lVar6 = 0x1c68;
        }
      }
      tVar2 = env->gregs[1];
      ptVar1 = (target_ulong *)((long)env->gregs + lVar6);
      *ptVar1 = env->gregs[0];
      ptVar1[1] = tVar2;
      tVar2 = env->gregs[3];
      ptVar1 = (target_ulong *)((long)env->gregs + lVar6 + 0x10);
      *ptVar1 = env->gregs[2];
      ptVar1[1] = tVar2;
      tVar2 = env->gregs[5];
      ptVar1 = (target_ulong *)((long)env->gregs + lVar6 + 0x20);
      *ptVar1 = env->gregs[4];
      ptVar1[1] = tVar2;
      tVar2 = env->gregs[7];
      ptVar1 = (target_ulong *)((long)env->gregs + lVar6 + 0x30);
      *ptVar1 = env->gregs[6];
      ptVar1[1] = tVar2;
      ptVar1 = (target_ulong *)((long)env->gregs + lVar3);
      tVar2 = ptVar1[1];
      env->gregs[0] = *ptVar1;
      env->gregs[1] = tVar2;
      ptVar1 = (target_ulong *)((long)env->gregs + lVar3 + 0x10);
      tVar2 = ptVar1[1];
      env->gregs[2] = *ptVar1;
      env->gregs[3] = tVar2;
      ptVar1 = (target_ulong *)((long)env->gregs + lVar3 + 0x20);
      tVar2 = ptVar1[1];
      env->gregs[4] = *ptVar1;
      env->gregs[5] = tVar2;
      ptVar1 = (target_ulong *)((long)env->gregs + lVar3 + 0x30);
      tVar2 = ptVar1[1];
      env->gregs[6] = *ptVar1;
      env->gregs[7] = tVar2;
    }
  }
  else {
    new_pstate = new_pstate & 0xfffff3fe;
  }
  env->pstate = new_pstate;
  return;
}

Assistant:

void cpu_change_pstate(CPUSPARCState *env, uint32_t new_pstate)
{
    uint32_t pstate_regs, new_pstate_regs;
    uint64_t *src, *dst;

    if (env->def.features & CPU_FEATURE_GL) {
        /* PS_AG, IG and MG are not implemented in this case */
        new_pstate &= ~(PS_AG | PS_IG | PS_MG);
        env->pstate = new_pstate;
        return;
    }

    pstate_regs = env->pstate & 0xc01;
    new_pstate_regs = new_pstate & 0xc01;

    if (new_pstate_regs != pstate_regs) {
        /* Switch global register bank */
        src = get_gregset(env, new_pstate_regs);
        dst = get_gregset(env, pstate_regs);
        memcpy32(dst, env->gregs);
        memcpy32(env->gregs, src);
    }
    env->pstate = new_pstate;
}